

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

void cnv_trap_obj(int otyp,int cnt,trap *ttmp)

{
  uint uVar1;
  obj *obj;
  obj *unaff_RBX;
  
  obj = mksobj(level,otyp,'\x01','\0');
  obj->quan = cnt;
  uVar1 = weight(obj);
  obj->owt = uVar1;
  if (otyp - 9U < 0xfffffffe) {
    obj->field_0x4b = obj->field_0x4b & 0x7f;
  }
  place_object(obj,level,(int)ttmp->tx,(int)ttmp->ty);
  if ((char)ttmp->field_0x8 < '\0') {
    sellobj(obj,ttmp->tx,ttmp->ty);
  }
  stackobj(unaff_RBX);
  newsym((int)ttmp->tx,(int)ttmp->ty);
  deltrap(level,ttmp);
  return;
}

Assistant:

static void cnv_trap_obj(int otyp, int cnt, struct trap *ttmp)
{
	struct obj *otmp = mksobj(level, otyp, TRUE, FALSE);
	otmp->quan=cnt;
	otmp->owt = weight(otmp);
	/* Only dart and shuriken traps are capable of being poisonous */
	if (otyp != DART && otyp != SHURIKEN)
	    otmp->opoisoned = 0;
	place_object(otmp, level, ttmp->tx, ttmp->ty);
	/* Sell your own traps only... */
	if (ttmp->madeby_u) sellobj(otmp, ttmp->tx, ttmp->ty);
	stackobj(otmp);
	newsym(ttmp->tx, ttmp->ty);
	deltrap(level, ttmp);
}